

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
option::Parser::Parser
          (Parser *this,bool gnu,Descriptor *usage,int argc,char **argv,Option *options,
          Option *buffer,int min_abbr_len,bool single_minus_longopt,int bufmax)

{
  this->op_count = 0;
  this->nonop_count = 0;
  this->nonop_args = (char **)0x0;
  this->err = false;
  parse(this,gnu,usage,argc,argv,options,buffer,min_abbr_len,single_minus_longopt,bufmax);
  return;
}

Assistant:

Parser(bool gnu, const Descriptor usage[], int argc, char** argv, Option options[], Option buffer[],
         int min_abbr_len = 0, bool single_minus_longopt = false, int bufmax = -1) :
      op_count(0), nonop_count(0), nonop_args(0), err(false)
  {
    parse(gnu, usage, argc, (const char**) argv, options, buffer, min_abbr_len, single_minus_longopt, bufmax);
  }